

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O0

void Abc_TruthNpnTest(char *pFileName,int NpnType,int nVarNum,int fDumpRes,int fBinary,int fVerbose)

{
  Abc_TtStore_t *p_00;
  char *local_38;
  char *pFileNameOut;
  Abc_TtStore_t *p;
  int fVerbose_local;
  int fBinary_local;
  int fDumpRes_local;
  int nVarNum_local;
  int NpnType_local;
  char *pFileName_local;
  
  p_00 = Abc_TtStoreLoad(pFileName,nVarNum);
  if (p_00 != (Abc_TtStore_t *)0x0) {
    Abc_TruthNpnPerform(p_00,NpnType,fVerbose);
    if (fDumpRes != 0) {
      if (fBinary == 0) {
        local_38 = Extra_FileNameGenericAppend(pFileName,"_out.txt");
      }
      else {
        local_38 = Extra_FileNameGenericAppend(pFileName,"_out.tt");
      }
      Abc_TtStoreWrite(local_38,p_00,fBinary);
      if (fVerbose != 0) {
        printf("The resulting functions are written into file \"%s\".\n",local_38);
      }
    }
    Abc_TtStoreFree(p_00,nVarNum);
  }
  return;
}

Assistant:

void Abc_TruthNpnTest( char * pFileName, int NpnType, int nVarNum, int fDumpRes, int fBinary, int fVerbose )
{
    Abc_TtStore_t * p;
    char * pFileNameOut;

    // read info from file
    p = Abc_TtStoreLoad( pFileName, nVarNum );
    if ( p == NULL )
        return;

    // consider functions from the file
    Abc_TruthNpnPerform( p, NpnType, fVerbose );

    // write the result
    if ( fDumpRes )
    {
        if ( fBinary )
            pFileNameOut = Extra_FileNameGenericAppend( pFileName, "_out.tt" );
        else
            pFileNameOut = Extra_FileNameGenericAppend( pFileName, "_out.txt" );
        Abc_TtStoreWrite( pFileNameOut, p, fBinary );
        if ( fVerbose )
            printf( "The resulting functions are written into file \"%s\".\n", pFileNameOut );
    }

    // delete data-structure
    Abc_TtStoreFree( p, nVarNum );
//    printf( "Finished computing canonical forms for functions from file \"%s\".\n", pFileName );
}